

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_image.cpp
# Opt level: O1

uint __thiscall
crnlib::dxt_image::get_subblock_index(dxt_image *this,uint x,uint y,uint element_index)

{
  uint uVar1;
  
  uVar1 = 0;
  if (this->m_element_type[element_index] == cColorETC1) {
    if ((this->m_pElements
         [((y >> 2) * this->m_blocks_x + (x >> 2)) * this->m_num_elements_per_block + element_index]
         .m_bytes[3] & 1) == 0) {
      y = x;
    }
    uVar1 = y >> 1 & 1;
  }
  return uVar1;
}

Assistant:

uint dxt_image::get_subblock_index(uint x, uint y, uint element_index) const
    {
        if (m_element_type[element_index] != cColorETC1)
        {
            return 0;
        }

        const uint block_x = x >> cDXTBlockShift;
        const uint block_y = y >> cDXTBlockShift;

        const element& block = get_element(block_x, block_y, element_index);

        const etc1_block& src_block = *reinterpret_cast<const etc1_block*>(&block);
        if (src_block.get_flip_bit())
        {
            return ((y & 3) >= 2) ? 1 : 0;
        }
        else
        {
            return ((x & 3) >= 2) ? 1 : 0;
        }
    }